

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

string * __thiscall helics::Filter::getString_abi_cxx11_(Filter *this,string_view property)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x40));
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ca64b);
    (*peVar2->_vptr_FilterOperations[5])(in_RDI,peVar2,in_RDX,in_RCX);
  }
  else {
    std::__cxx11::string::string(in_stack_ffffffffffffffd0);
  }
  return in_RDI;
}

Assistant:

std::string Filter::getString(std::string_view property)
{
    if (filtOp) {
        return filtOp->getString(property);
    }
    return {};
}